

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::PreserveBackBufferCase::iterate(PreserveBackBufferCase *this)

{
  EGLDisplay pvVar1;
  EGLDisplay pvVar2;
  bool condition;
  deUint32 dVar3;
  deBool dVar4;
  GLenum GVar5;
  Library *egl_00;
  UniqueSurface *pUVar6;
  EGLSurface pvVar7;
  EGLSurface read;
  UniqueContext *this_00;
  EGLContext context;
  TestLog *pTVar8;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  LogImage local_298;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  LogImage local_1b8;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  LogImageSet local_d8;
  Vector<int,_2> local_98;
  undefined1 local_90 [8];
  Surface newSurface;
  IVec2 newEglSize;
  Vector<int,_2> local_68;
  undefined1 local_60 [8];
  Surface oldSurface;
  Vector<int,_2> local_3c;
  IVec2 oldEglSize;
  undefined1 local_28 [8];
  ScopedCurrentContext currentCtx;
  Library *egl;
  PreserveBackBufferCase *this_local;
  
  egl_00 = EglTestContext::getLibrary((this->super_ResizeTest).super_TestCase.m_eglTestCtx);
  pvVar1 = (this->super_ResizeTest).m_display;
  currentCtx.m_display = egl_00;
  pUVar6 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
           operator*(&(this->super_ResizeTest).m_surface.
                      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                    );
  pvVar7 = eglu::UniqueSurface::operator*(pUVar6);
  pUVar6 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
           operator*(&(this->super_ResizeTest).m_surface.
                      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                    );
  read = eglu::UniqueSurface::operator*(pUVar6);
  this_00 = de::details::UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>::
            operator*(&(this->super_ResizeTest).m_context.
                       super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>
                     );
  context = eglu::UniqueContext::operator*(this_00);
  eglu::ScopedCurrentContext::ScopedCurrentContext
            ((ScopedCurrentContext *)local_28,egl_00,pvVar1,pvVar7,read,context);
  do {
    pvVar2 = currentCtx.m_display;
    pvVar1 = (this->super_ResizeTest).m_display;
    pUVar6 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
             ::operator*(&(this->super_ResizeTest).m_surface.
                          super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                        );
    pvVar7 = eglu::UniqueSurface::operator*(pUVar6);
    (**(code **)(*pvVar2 + 0x180))(pvVar2,pvVar1,pvVar7,0x3093,0x3094);
    dVar3 = (**(code **)(*currentCtx.m_display + 0xf8))();
    eglu::checkError(dVar3,
                     "surfaceAttrib(m_display, **m_surface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                     ,0x186);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  GVar5 = (*(this->super_ResizeTest).m_gl.getError)();
  glu::checkError(GVar5,"GL state erroneous upon initialization!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                  ,0x188);
  pvVar2 = currentCtx.m_display;
  pvVar1 = (this->super_ResizeTest).m_display;
  pUVar6 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
           operator*(&(this->super_ResizeTest).m_surface.
                      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                    );
  pvVar7 = eglu::UniqueSurface::operator*(pUVar6);
  eglu::getSurfaceSize((eglu *)&local_3c,(Library *)pvVar2,pvVar1,pvVar7);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)((long)&oldSurface.m_pixels.m_cap + 4),&local_3c);
  initSurface(&(this->super_ResizeTest).m_gl,(IVec2 *)((long)&oldSurface.m_pixels.m_cap + 4));
  (*(this->super_ResizeTest).m_gl.finish)();
  GVar5 = (*(this->super_ResizeTest).m_gl.getError)();
  glu::checkError(GVar5,"glFinish() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                  ,399);
  tcu::Vector<int,_2>::Vector(&local_68,&local_3c);
  readSurface((Surface *)local_60,&(this->super_ResizeTest).m_gl,&local_68);
  pvVar2 = currentCtx.m_display;
  pvVar1 = (this->super_ResizeTest).m_display;
  pUVar6 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
           operator*(&(this->super_ResizeTest).m_surface.
                      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                    );
  pvVar7 = eglu::UniqueSurface::operator*(pUVar6);
  (**(code **)(*pvVar2 + 0x188))(pvVar2,pvVar1,pvVar7);
  tcu::Vector<int,_2>::Vector(&newEglSize,&(this->super_ResizeTest).m_newSize);
  ResizeTest::resize(&this->super_ResizeTest,&newEglSize);
  pvVar2 = currentCtx.m_display;
  pvVar1 = (this->super_ResizeTest).m_display;
  pUVar6 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
           operator*(&(this->super_ResizeTest).m_surface.
                      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                    );
  pvVar7 = eglu::UniqueSurface::operator*(pUVar6);
  (**(code **)(*pvVar2 + 0x188))(pvVar2,pvVar1,pvVar7);
  dVar3 = (**(code **)(*currentCtx.m_display + 0xf8))();
  eglu::checkError(dVar3,"eglSwapBuffers()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0x197);
  pvVar2 = currentCtx.m_display;
  pvVar1 = (this->super_ResizeTest).m_display;
  pUVar6 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
           operator*(&(this->super_ResizeTest).m_surface.
                      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                    );
  pvVar7 = eglu::UniqueSurface::operator*(pUVar6);
  eglu::getSurfaceSize((eglu *)&newSurface.m_pixels.m_cap,(Library *)pvVar2,pvVar1,pvVar7);
  tcu::Vector<int,_2>::Vector(&local_98,(Vector<int,_2> *)&newSurface.m_pixels.m_cap);
  readSurface((Surface *)local_90,&(this->super_ResizeTest).m_gl,&local_98);
  pTVar8 = (this->super_ResizeTest).m_log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Corner comparison",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"Comparing old and new surfaces at all corners",&local_121);
  tcu::LogImageSet::LogImageSet(&local_d8,&local_f8,&local_120);
  pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"Before resizing",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"Before resizing",&local_201);
  tcu::LogImage::LogImage
            (&local_1b8,&local_1d8,&local_200,(Surface *)local_60,QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_1b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"After resizing",&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"After resizing",&local_2e1);
  tcu::LogImage::LogImage
            (&local_298,&local_2b8,&local_2e0,(Surface *)local_90,QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar8 = tcu::TestLog::operator<<(pTVar8,&local_298);
  tcu::TestLog::operator<<(pTVar8,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  tcu::LogImage::~LogImage(&local_298);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  tcu::LogImage::~LogImage(&local_1b8);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  tcu::LogImageSet::~LogImageSet(&local_d8);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  condition = compareCorners((Surface *)local_60,(Surface *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,
             "Resizing the native window changed the contents of the EGL surface",&local_309);
  tcu::ResultCollector::checkResult
            (&(this->super_ResizeTest).m_status,condition,QP_TEST_RESULT_QUALITY_WARNING,&local_308)
  ;
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  tcu::Surface::~Surface((Surface *)local_90);
  tcu::Surface::~Surface((Surface *)local_60);
  tcu::ResultCollector::setTestContextResult
            (&(this->super_ResizeTest).m_status,
             (this->super_ResizeTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  eglu::ScopedCurrentContext::~ScopedCurrentContext((ScopedCurrentContext *)local_28);
  return STOP;
}

Assistant:

IterateResult PreserveBackBufferCase::iterate (void)
{
	const Library&			egl			= m_eglTestCtx.getLibrary();
	ScopedCurrentContext	currentCtx	(egl, m_display, **m_surface, **m_surface, **m_context);

	EGLU_CHECK_CALL(egl, surfaceAttrib(m_display, **m_surface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED));

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "GL state erroneous upon initialization!");

	{
		const IVec2 oldEglSize = eglu::getSurfaceSize(egl, m_display, **m_surface);
		initSurface(m_gl, oldEglSize);

		m_gl.finish();
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glFinish() failed");

		{
			const Surface oldSurface = readSurface(m_gl, oldEglSize);

			egl.swapBuffers(m_display, **m_surface);
			this->resize(m_newSize);
			egl.swapBuffers(m_display, **m_surface);
			EGLU_CHECK_MSG(egl, "eglSwapBuffers()");

			{
				const IVec2		newEglSize	= eglu::getSurfaceSize(egl, m_display, **m_surface);
				const Surface	newSurface	= readSurface(m_gl, newEglSize);

				m_log << TestLog::ImageSet("Corner comparison",
										   "Comparing old and new surfaces at all corners")
					  << TestLog::Image("Before resizing", "Before resizing", oldSurface)
					  << TestLog::Image("After resizing", "After resizing", newSurface)
					  << TestLog::EndImageSet;

				m_status.checkResult(compareCorners(oldSurface, newSurface),
									 QP_TEST_RESULT_QUALITY_WARNING,
									 "Resizing the native window changed the contents of "
									 "the EGL surface");
			}
		}
	}

	m_status.setTestContextResult(m_testCtx);
	return STOP;
}